

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O2

xcore_reg XCore_reg_id(char *name)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0x18;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x1b8) {
      return XCORE_REG_INVALID;
    }
    iVar2 = strcmp(name,*(char **)((long)&reg_name_maps[0].id + lVar3));
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return *(xcore_reg *)((long)&group_name_maps[6].name + lVar3);
}

Assistant:

xcore_reg XCore_reg_id(char *name)
{
	int i;

	for(i = 1; i < ARR_SIZE(reg_name_maps); i++) {
		if (!strcmp(name, reg_name_maps[i].name))
			return reg_name_maps[i].id;
	}

	// not found
	return 0;
}